

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O0

void HostGame(int i)

{
  int iVar1;
  uint uVar2;
  char *__nptr;
  int local_8c;
  undefined1 local_88 [4];
  int i_1;
  int gotack [9];
  int local_58;
  uint local_54;
  int node;
  int numplayers;
  PreGamePacket packet;
  int i_local;
  
  packet.machines[7].address = i;
  iVar1 = DArgs::NumArgs(Args);
  if (i != iVar1 + -1) {
    __nptr = DArgs::GetArg(Args,packet.machines[7].address + 1);
    local_54 = atoi(__nptr);
    if (local_54 != 0) goto LAB_005e36a1;
  }
  local_54 = 2;
LAB_005e36a1:
  if ((int)local_54 < 9) {
    if (local_54 == 1) {
      netgame = false;
      multiplayer = true;
      doomcom.id = 0x12345678;
      doomcom.numnodes = 1;
      doomcom.numplayers = 1;
      doomcom.consoleplayer = 0;
    }
    else {
      StartNetwork(false);
      doomcom.consoleplayer = 0;
      Printf("Console player number: %d\n",0);
      doomcom.numnodes = 1;
      addterm(SendAbort,"SendAbort");
      (*StartScreen->_vptr_FStartupScreen[5])(StartScreen,"Waiting for players",(ulong)local_54);
      uVar2 = (*StartScreen->_vptr_FStartupScreen[9])
                        (StartScreen,Host_CheckForConnects,(long)(int)local_54);
      if ((uVar2 & 1) == 0) {
        exit(0);
      }
      memset(local_88,0,0x24);
      (*StartScreen->_vptr_FStartupScreen[7])(StartScreen,"Sending all here.");
      (*StartScreen->_vptr_FStartupScreen[5])(StartScreen,"Done waiting",1);
      uVar2 = (*StartScreen->_vptr_FStartupScreen[9])(StartScreen,Host_SendAllHere,local_88);
      if ((uVar2 & 1) == 0) {
        exit(0);
      }
      popterm();
      (*StartScreen->_vptr_FStartupScreen[7])(StartScreen,"Go");
      node._0_1_ = 0x30;
      node._1_1_ = 7;
      for (local_58 = 1; local_58 < doomcom.numnodes; local_58 = local_58 + 1) {
        for (local_8c = 8; local_8c != 0; local_8c = local_8c + -1) {
          PreSend(&node,2,sendaddress + local_58);
        }
      }
      (*StartScreen->_vptr_FStartupScreen[7])
                (StartScreen,"Total players: %d",(ulong)(uint)(int)doomcom.numnodes);
      doomcom.id = 0x12345678;
      doomcom.numplayers = doomcom.numnodes;
      for (packet.machines[7].address = 0; (int)packet.machines[7].address < (int)doomcom.numnodes;
          packet.machines[7].address = packet.machines[7].address + 1) {
        sendplayer[(int)packet.machines[7].address] = (BYTE)packet.machines[7].address;
      }
    }
  }
  else {
    I_FatalError("You cannot host a game with %d players. The limit is currently %d.",
                 (ulong)local_54,8);
  }
  return;
}

Assistant:

void HostGame (int i)
{
	PreGamePacket packet;
	int numplayers;
	int node;
	int gotack[MAXNETNODES+1];

	if ((i == Args->NumArgs() - 1) || !(numplayers = atoi (Args->GetArg(i+1))))
	{	// No player count specified, assume 2
		numplayers = 2;
	}

	if (numplayers > MAXNETNODES)
	{
		I_FatalError("You cannot host a game with %d players. The limit is currently %d.", numplayers, MAXNETNODES);
		return;
	}

	if (numplayers == 1)
	{ // Special case: Only 1 player, so don't bother starting the network
		netgame = false;
		multiplayer = true;
		doomcom.id = DOOMCOM_ID;
		doomcom.numplayers = doomcom.numnodes = 1;
		doomcom.consoleplayer = 0;
		return;
	}

	StartNetwork (false);

	// [JC] - this computer is starting the game, therefore it should
	// be the Net Arbitrator.
	doomcom.consoleplayer = 0;
	Printf ("Console player number: %d\n", doomcom.consoleplayer);

	doomcom.numnodes = 1;

	atterm (SendAbort);

	StartScreen->NetInit ("Waiting for players", numplayers);

	// Wait for numplayers-1 different connections
	if (!StartScreen->NetLoop (Host_CheckForConnects, (void *)(intptr_t)numplayers))
	{
		exit (0);
	}

	// Now inform everyone of all machines involved in the game
	memset (gotack, 0, sizeof(gotack));
	StartScreen->NetMessage ("Sending all here.");
	StartScreen->NetInit ("Done waiting", 1);

	if (!StartScreen->NetLoop (Host_SendAllHere, (void *)gotack))
	{
		exit (0);
	}

	popterm ();

	// Now go
	StartScreen->NetMessage ("Go");
	packet.Fake = PRE_FAKE;
	packet.Message = PRE_GO;
	for (node = 1; node < doomcom.numnodes; node++)
	{
		// If we send the packets eight times to each guest,
		// hopefully at least one of them will get through.
		for (int i = 8; i != 0; --i)
		{
			PreSend (&packet, 2, &sendaddress[node]);
		}
	}

	StartScreen->NetMessage ("Total players: %d", doomcom.numnodes);

	doomcom.id = DOOMCOM_ID;
	doomcom.numplayers = doomcom.numnodes;

	// On the host, each player's number is the same as its node number
	for (i = 0; i < doomcom.numnodes; ++i)
	{
		sendplayer[i] = i;
	}
}